

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_point start_time_00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  char **matrix_00;
  char *pcVar7;
  reference pvVar8;
  pointer ppVar9;
  pointer ppVar10;
  reference piVar11;
  ostream *poVar12;
  long in_RSI;
  undefined1 auVar13 [16];
  int *in_stack_00000028;
  finalStatesType *in_stack_00000030;
  startStatesType *in_stack_00000038;
  adjacencyType *in_stack_00000040;
  string *in_stack_00000048;
  int i_6;
  int finalDFA;
  int startDFA;
  int finalStateForNonTerm;
  iterator __end8;
  iterator __begin8;
  vector<int,_std::allocator<int>_> *__range8;
  iterator nonTermFinalIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nonTerm;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  int finalGrm_1;
  int j_2;
  iterator nonTermStartIter;
  int startGrm_1;
  char *matrixRow_1;
  int i_5;
  int i_4;
  int i_3;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> futArr;
  int j_1;
  int i_2;
  indexArrayType indexArray;
  type parallelClosure;
  __m256i ik;
  int step;
  uint THREADS;
  bool needOneMoreStep;
  int i_1;
  int finalGrm;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  iterator finalsIter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *by;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  int startGrm;
  pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *iter;
  iterator __end1;
  iterator __begin1;
  startStatesType *__range1;
  time_point start_time;
  int j;
  char *matrixRow;
  int i;
  char **matrix;
  int matrixSizeTo32;
  vector<edge,_std::allocator<edge>_> newEdges;
  adjacencyType DFA;
  finalStatesType finalStatesRFA;
  startStatesType startStatesRFA;
  adjacencyType RFA;
  int in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  edge *in_stack_fffffffffffffb28;
  edge *in_stack_fffffffffffffb30;
  allocator_type *in_stack_fffffffffffffb38;
  string *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  size_type in_stack_fffffffffffffb50;
  allocator *paVar14;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  int startK;
  undefined1 auVar15 [16];
  int in_stack_fffffffffffffbe0;
  vector<edge,_std::allocator<edge>_> *DFAedges;
  int local_3f0;
  allocator local_3e9;
  string local_3e8 [24];
  string *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  adjacencyType *in_stack_fffffffffffffc40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_380;
  vector<int,_std::allocator<int>_> *local_378;
  _Self local_370;
  _Self local_368;
  reference local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_348;
  int local_340;
  int local_33c;
  _Self local_338;
  _Self local_330;
  int local_324;
  char *local_320;
  int local_318;
  uint local_2f8;
  int local_2f4;
  uint local_2dc;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_2d8;
  pair<int,_int> local_2c0;
  int local_2b8;
  int local_2b4;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> local_2b0;
  char ***local_298;
  undefined1 *local_290;
  int local_288;
  undefined1 local_280 [16];
  vector<edge,_std::allocator<edge>_> *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  adjacencyType *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffda8;
  int local_240;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_230;
  vector<int,_std::allocator<int>_> *local_228;
  _Base_ptr local_220;
  reference local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_200;
  int local_1f4;
  reference local_1f0;
  _Self local_1e8;
  _Self local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  int local_1c4;
  char *local_1c0;
  int local_1b4;
  char **local_1b0;
  int local_1a8;
  allocator local_1a1;
  string local_1a0 [111];
  allocator local_131;
  string local_130 [80];
  undefined1 local_e0 [72];
  long local_98;
  int local_88;
  undefined1 local_81;
  undefined1 local_80 [32];
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined1 local_48;
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42;
  undefined1 local_41;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_88 = 0;
  local_98 = in_RSI;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
            *)0x139136);
  std::
  map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x139143);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x139150);
  pcVar7 = *(char **)(local_98 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,pcVar7,&local_131);
  readRFA(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028)
  ;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
            *)0x1391ed);
  std::allocator<edge>::allocator((allocator<edge> *)0x139202);
  std::vector<edge,_std::allocator<edge>_>::vector
            ((vector<edge,_std::allocator<edge>_> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (size_type)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  std::allocator<edge>::~allocator((allocator<edge> *)0x13922a);
  DFAedges = *(vector<edge,_std::allocator<edge>_> **)(local_98 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,(char *)DFAedges,&local_1a1);
  readDFA(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
          in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  matrixSize = numOfStatesDFA * numOfStatesRFA;
  iVar5 = matrixSize;
  if (matrixSize % 0x20 != 0) {
    in_stack_fffffffffffffbe0 = matrixSize;
    iVar5 = matrixSize + (0x20 - matrixSize % 0x20);
  }
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (long)matrixSize;
  uVar6 = SUB168(auVar15 * ZEXT816(8),0);
  if (SUB168(auVar15 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_1a8 = iVar5;
  matrix_00 = (char **)operator_new__(uVar6);
  local_1b0 = matrix_00;
  for (local_1b4 = 0; local_1b4 < matrixSize; local_1b4 = local_1b4 + 1) {
    pcVar7 = (char *)operator_new__((long)local_1a8);
    local_1b0[local_1b4] = pcVar7;
    local_1c0 = local_1b0[local_1b4];
    for (local_1c4 = 0; local_1c4 < local_1a8; local_1c4 = local_1c4 + 1) {
      local_1c0[local_1c4] = '\0';
    }
  }
  local_1d0 = std::chrono::_V2::steady_clock::now();
  local_1d8 = local_e0;
  local_1e0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::begin((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  local_1e8._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
  while (bVar1 = std::operator!=(&local_1e0,&local_1e8), bVar1) {
    local_1f0 = std::
                _Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)0x139571);
    local_1f4 = local_1f0->first;
    local_200 = &local_1f0->second;
    local_208._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffb28,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
          bVar1) {
      local_218 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_208);
      local_220 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                         (key_type *)0x139610);
      ppVar10 = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                              *)0x139637);
      local_228 = &ppVar10->second;
      local_230._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffb28,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)),
            bVar1) {
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&local_230);
        if (local_1f4 == *piVar11) {
          for (local_240 = 0; local_240 < numOfStatesDFA; local_240 = local_240 + 1) {
            insertToFiniteAutomation
                      (in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                       (int)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_230);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_208);
    }
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffb28);
  }
  uVar3 = std::thread::hardware_concurrency();
  uVar4 = (uint)matrixSize / uVar3;
  local_81 = 1;
  startK = CONCAT13(1,(int3)in_stack_fffffffffffffb9c);
  local_31 = 1;
  local_32 = 1;
  local_33 = 1;
  local_34 = 1;
  local_35 = 1;
  local_36 = 1;
  local_37 = 1;
  local_38 = 1;
  local_39 = 1;
  local_3a = 1;
  local_3b = 1;
  local_3c = 1;
  local_3d = 1;
  local_3e = 1;
  local_3f = 1;
  local_40 = 1;
  local_41 = 1;
  local_42 = 1;
  local_43 = 1;
  local_44 = 1;
  local_45 = 1;
  local_46 = 1;
  local_47 = 1;
  local_48 = 1;
  local_49 = 1;
  local_4a = 1;
  local_4b = 1;
  local_4c = 1;
  local_4d = 1;
  local_4e = 1;
  local_4f = 1;
  local_50 = 1;
  auVar15 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar15 = vpinsrb_avx(auVar15,1,2);
  auVar15 = vpinsrb_avx(auVar15,1,3);
  auVar15 = vpinsrb_avx(auVar15,1,4);
  auVar15 = vpinsrb_avx(auVar15,1,5);
  auVar15 = vpinsrb_avx(auVar15,1,6);
  auVar15 = vpinsrb_avx(auVar15,1,7);
  auVar15 = vpinsrb_avx(auVar15,1,8);
  auVar15 = vpinsrb_avx(auVar15,1,9);
  auVar15 = vpinsrb_avx(auVar15,1,10);
  auVar15 = vpinsrb_avx(auVar15,1,0xb);
  auVar15 = vpinsrb_avx(auVar15,1,0xc);
  auVar15 = vpinsrb_avx(auVar15,1,0xd);
  auVar15 = vpinsrb_avx(auVar15,1,0xe);
  auVar15 = vpinsrb_avx(auVar15,1,0xf);
  auVar13 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar13 = vpinsrb_avx(auVar13,1,2);
  auVar13 = vpinsrb_avx(auVar13,1,3);
  auVar13 = vpinsrb_avx(auVar13,1,4);
  auVar13 = vpinsrb_avx(auVar13,1,5);
  auVar13 = vpinsrb_avx(auVar13,1,6);
  auVar13 = vpinsrb_avx(auVar13,1,7);
  auVar13 = vpinsrb_avx(auVar13,1,8);
  auVar13 = vpinsrb_avx(auVar13,1,9);
  auVar13 = vpinsrb_avx(auVar13,1,10);
  auVar13 = vpinsrb_avx(auVar13,1,0xb);
  auVar13 = vpinsrb_avx(auVar13,1,0xc);
  auVar13 = vpinsrb_avx(auVar13,1,0xd);
  auVar13 = vpinsrb_avx(auVar13,1,0xe);
  auVar13 = vpinsrb_avx(auVar13,1,0xf);
  local_80._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar13;
  local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
  local_298 = &local_1b0;
  local_290 = local_280;
  local_288 = local_1a8;
  auVar15 = local_80._0_16_;
  auVar13 = local_80._16_16_;
  local_280 = local_80._0_16_;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x139a97);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::reserve
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  for (local_2b4 = 0; local_2b4 < numOfStatesDFA; local_2b4 = local_2b4 + 1) {
    for (local_2b8 = 0; local_2b8 < numOfStatesRFA; local_2b8 = local_2b8 + 1) {
      local_2c0 = std::make_pair<int&,int&>
                            ((int *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                             (int *)0x139b01);
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
      emplace_back<std::pair<int,int>>
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffb38,(pair<int,_int> *)in_stack_fffffffffffffb30);
    }
  }
  do {
    bVar1 = false;
    updateMatrix(DFAedges,(adjacencyType *)CONCAT44(iVar5,in_stack_fffffffffffffbe0),matrix_00);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)0x139bad);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::reserve
              (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    local_2dc = 0;
    while( true ) {
      if (uVar3 - 1 <= local_2dc) break;
      local_2f4 = local_2dc * uVar4;
      std::async<main::__0&,int,int&>
                (auVar13._4_4_,auVar15._8_8_,(int *)auVar15._0_8_,
                 (int *)CONCAT44(startK,in_stack_fffffffffffffb98));
      std::vector<std::future<void>,std::allocator<std::future<void>>>::
      emplace_back<std::future<void>>
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                 in_stack_fffffffffffffb38,(future<void> *)in_stack_fffffffffffffb30);
      std::future<void>::~future((future<void> *)0x139c49);
      local_2dc = local_2dc + 1;
    }
    std::
    tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/IvanTyulyandin[P]challenge/main.cpp:142:28),_int,_int>_>
    ::type::operator()(auVar15._0_8_,startK,in_stack_fffffffffffffb98);
    for (local_2f8 = 0; local_2f8 < uVar3 - 1; local_2f8 = local_2f8 + 1) {
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::operator[]
                (&local_2d8,(long)(int)local_2f8);
      std::future<void>::get((future<void> *)in_stack_fffffffffffffb38);
    }
    std::allocator<edge>::allocator((allocator<edge> *)0x139d27);
    std::vector<edge,_std::allocator<edge>_>::vector
              ((vector<edge,_std::allocator<edge>_> *)
               CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               (size_type)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::vector<edge,_std::allocator<edge>_>::operator=
              ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffb38,
               (vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffb30);
    std::vector<edge,_std::allocator<edge>_>::~vector
              ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffb38);
    std::allocator<edge>::~allocator((allocator<edge> *)0x139d6e);
    for (local_318 = 0; local_318 < matrixSize; local_318 = local_318 + 1) {
      local_320 = local_1b0[local_318];
      pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &local_2b0,(long)local_318);
      local_324 = pvVar8->second;
      local_330._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                  (key_type *)0x139ddc);
      local_338._M_node =
           (_Base_ptr)
           std::
           map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      bVar2 = std::operator!=(&local_330,&local_338);
      if (bVar2) {
        for (local_33c = 0; local_33c < matrixSize; local_33c = local_33c + 1) {
          if (local_320[local_33c] != '\0') {
            pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)&local_2b0,(long)local_33c);
            local_340 = pvVar8->second;
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)0x139e87);
            local_348 = &ppVar9->second;
            local_350._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
            local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffb28,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
              if (!bVar2) break;
              local_360 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_350);
              local_368._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                          (key_type *)0x139f05);
              local_370._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
              bVar2 = std::operator!=(&local_368,&local_370);
              if (bVar2) {
                ppVar10 = std::
                          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                          ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                                        *)0x139f59);
                local_378 = &ppVar10->second;
                local_380._M_current =
                     (int *)std::vector<int,_std::allocator<int>_>::begin
                                      ((vector<int,_std::allocator<int>_> *)
                                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)
                                      );
                std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
                while( true ) {
                  bVar2 = __gnu_cxx::operator!=
                                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)in_stack_fffffffffffffb28,
                                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20
                                                ));
                  if (!bVar2) break;
                  piVar11 = __gnu_cxx::
                            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                            operator*(&local_380);
                  if (*piVar11 == local_340) {
                    in_stack_fffffffffffffb58 = &local_2b0;
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffb58,(long)local_318);
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )in_stack_fffffffffffffb58,(long)local_33c);
                    bVar2 = insertToFiniteAutomation
                                      (in_stack_fffffffffffffc40,
                                       (int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
                                       (int)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
                    if (bVar2) {
                      edge::edge(in_stack_fffffffffffffb28,in_stack_fffffffffffffb24,
                                 in_stack_fffffffffffffb20,(string *)0x13a06e);
                      std::vector<edge,_std::allocator<edge>_>::emplace_back<edge>
                                ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffb38,
                                 in_stack_fffffffffffffb30);
                      edge::~edge((edge *)0x13a094);
                      bVar1 = true;
                    }
                  }
                  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator++(&local_380);
                }
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_350);
            }
          }
        }
      }
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
              ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
               in_stack_fffffffffffffb38);
  } while (bVar1);
  paVar14 = &local_3e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3e8,"",paVar14);
  start_time_00.__d.__r._4_4_ = in_stack_fffffffffffffb4c;
  start_time_00.__d.__r._0_4_ = in_stack_fffffffffffffb48;
  getCurTime(start_time_00,in_stack_fffffffffffffb40);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  iVar5 = countResult(auVar15._8_8_);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
  std::operator<<(poVar12,"\n");
  for (local_3f0 = 0; local_3f0 < matrixSize; local_3f0 = local_3f0 + 1) {
    in_stack_fffffffffffffb38 = (allocator_type *)local_1b0[local_3f0];
    if (in_stack_fffffffffffffb38 != (allocator_type *)0x0) {
      operator_delete__(in_stack_fffffffffffffb38);
    }
  }
  if (local_1b0 != (char **)0x0) {
    operator_delete__(local_1b0);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             in_stack_fffffffffffffb38);
  std::vector<edge,_std::allocator<edge>_>::~vector
            ((vector<edge,_std::allocator<edge>_> *)in_stack_fffffffffffffb38);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
             *)in_stack_fffffffffffffb38);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x13a315);
  std::
  map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)0x13a322);
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
  ::~vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
             *)in_stack_fffffffffffffb38);
  return local_88;
}

Assistant:

int main(int argc, char* argv[]) {

    adjacencyType RFA;
    startStatesType startStatesRFA;
    finalStatesType finalStatesRFA;
    readRFA(argv[1], RFA, startStatesRFA, finalStatesRFA, numOfStatesRFA);

    adjacencyType DFA;
    vector<edge> newEdges = vector<edge>(0);
    readDFA(argv[2], DFA, numOfStatesDFA, newEdges);

	matrixSize = numOfStatesDFA * numOfStatesRFA;

	int matrixSizeTo32 = matrixSize % 32 == 0 ? matrixSize : matrixSize + (32 - matrixSize % 32); // for AVX2
	auto matrix = new char * [matrixSize];
    for (auto i = 0; i < matrixSize; ++ i) {
        matrix[i] = new char[matrixSizeTo32];
        char * matrixRow = matrix[i];
        for (auto j = 0; j < matrixSizeTo32; ++ j) {
            matrixRow[j] = 0;
        }
    }

	auto start_time = std::chrono::steady_clock::now();

    // add edges to automation, if nonterminal start == end
    for (auto & iter : startStatesRFA) {
        int startGrm = iter.first;
        for (auto & by : iter.second) {
            auto finalsIter = finalStatesRFA.find(by);
            // if it is equal to end iterator => incorrect input
            for (auto finalGrm : finalsIter->second) {
                if (startGrm == finalGrm) {
                    for (auto i = 0; i < numOfStatesDFA; ++ i) {
                        insertToFiniteAutomation(DFA, i, i, by);
                    }
                }
            }
        }
    }

    bool needOneMoreStep = false;


    auto THREADS = std::thread::hardware_concurrency() - 1;
    int step = matrixSize / (THREADS + 1);

    __m256i ik = _mm256_set1_epi8(1); // PogChamp

    auto parallelClosure = [&matrix, &ik, matrixSizeTo32](int startK, int howMuch) {
        int endK = startK + howMuch;
        for (auto k = startK; k < endK; ++ k) {
            for (auto i = 0; i < matrixSize; ++ i) {
                char * matrixRow = matrix[i];
                if (matrixRow[k]) {
					for (auto j = 0; j < matrixSizeTo32; j += 32) {
						__m256i ij = _mm256_loadu_si256((__m256i const *) &matrixRow[j]);
						__m256i kj = _mm256_loadu_si256((__m256i const *) &matrix[k][j]);

						_mm256_storeu_si256((__m256i *) &matrixRow[j], _mm256_or_si256(ij, _mm256_and_si256(ik, kj)));
					}
//					for (auto j = 0; j < matrixSize; ++ j) {
//						if (matrix[k][j]) {
//							matrixRow[j] = true;
//						}
//					}
                }
            }
        }
    };

	indexArrayType indexArray;
	indexArray.reserve(static_cast<unsigned int>(numOfStatesDFA * numOfStatesRFA));

	for (int i = 0; i < numOfStatesDFA; ++ i) {
		for (int j = 0; j < numOfStatesRFA; ++ j) {
			indexArray.emplace_back(make_pair(i, j));
		}
	}

    do {
        needOneMoreStep = false;

        // stage 1: add info about new edges to matrix
        updateMatrix(newEdges, RFA, matrix);

        //getCurTime(start_time, "1 stage done");


        vector<future<void>> futArr;
        futArr.reserve(THREADS);
        for (auto i = 0; i < THREADS; ++ i) {
            futArr.emplace_back(std::async(launch::async, parallelClosure, i * step, step));
        }

        parallelClosure(THREADS * step, matrixSize - THREADS * step);

        for (auto i = 0; i < THREADS; ++ i) {
            futArr[i].get();
        }

        // stage 2: closure
        //getCurTime(start_time, "2 stage done");

		//cout << countResult(DFA) << " before\n";
        newEdges = vector<edge>(0);
        for (auto i = 0; i < matrixSize; ++ i) {
            char * matrixRow = matrix[i];
            int startGrm = indexArray[i].second;
            auto nonTermStartIter = startStatesRFA.find(startGrm);
            if (nonTermStartIter != startStatesRFA.end()) {
                for (auto j = 0; j < matrixSize; ++ j) {
                    if (matrixRow[j]) {
                        int finalGrm = indexArray[j].second;
                        for (auto & nonTerm : nonTermStartIter->second) {
                            auto nonTermFinalIter = finalStatesRFA.find(nonTerm);
                            if (nonTermFinalIter != finalStatesRFA.end()) {
                                for (auto finalStateForNonTerm : nonTermFinalIter->second) {
                                    if (finalStateForNonTerm == finalGrm) {
                                        int startDFA = indexArray[i].first;
                                        int finalDFA = indexArray[j].first;
                                        if (insertToFiniteAutomation(DFA, startDFA, finalDFA, nonTerm)) {
											newEdges.emplace_back(move(edge(startDFA, finalDFA, nonTerm)));
											needOneMoreStep = true;
                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }

        }
        //getCurTime(start_time, "3 stage done");
		//cout << countResult(DFA) << " after\n";
    } while (needOneMoreStep);

    getCurTime(start_time, "");
    cout << countResult(DFA) << "\n";

    for (auto i = 0; i < matrixSize; ++ i) {
    	delete[](matrix[i]);
    }
    delete[](matrix);

}